

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

JitTypePropertyGuard * __thiscall
Lowerer::CreateTypePropertyGuardForGuardedProperties
          (Lowerer *this,JITTypeHolder type,PropertySymOpnd *propertySymOpnd)

{
  code *pcVar1;
  anon_class_24_3_ccc5e030 link;
  bool bVar2;
  BVSparse<Memory::JitArenaAllocator> *pBVar3;
  undefined4 *puVar4;
  JITTimeWorkItem *this_00;
  FunctionJITTimeInfo *this_01;
  JitTypePropertyGuard *local_28;
  JitTypePropertyGuard *guard;
  PropertySymOpnd *propertySymOpnd_local;
  Lowerer *this_local;
  JITTypeHolder type_local;
  
  guard = (JitTypePropertyGuard *)propertySymOpnd;
  propertySymOpnd_local = (PropertySymOpnd *)this;
  this_local = (Lowerer *)type.t;
  pBVar3 = IR::PropertySymOpnd::GetGuardedPropOps(propertySymOpnd);
  if (pBVar3 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1ee7,"(propertySymOpnd->GetGuardedPropOps() != nullptr)",
                       "propertySymOpnd->GetGuardedPropOps() != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  local_28 = (JitTypePropertyGuard *)0x0;
  this_00 = Func::GetWorkItem(this->m_func);
  this_01 = JITTimeWorkItem::GetJITTimeInfo(this_00);
  bVar2 = FunctionJITTimeInfo::HasSharedPropertyGuards(this_01);
  if (bVar2) {
    pBVar3 = IR::PropertySymOpnd::GetGuardedPropOps((PropertySymOpnd *)guard);
    link.type.t = (Type)this_local;
    link.this = this;
    link.guard = &local_28;
    LinkGuardToGuardedProperties<Lowerer::CreateTypePropertyGuardForGuardedProperties(JITTypeHolderBase<void>,IR::PropertySymOpnd*)::__0>
              (this,pBVar3,link);
  }
  return local_28;
}

Assistant:

Js::JitTypePropertyGuard*
Lowerer::CreateTypePropertyGuardForGuardedProperties(JITTypeHolder type, IR::PropertySymOpnd* propertySymOpnd)
{
    // We should always have a list of guarded properties.
    Assert(propertySymOpnd->GetGuardedPropOps() != nullptr);

    Js::JitTypePropertyGuard* guard = nullptr;

    if (m_func->GetWorkItem()->GetJITTimeInfo()->HasSharedPropertyGuards())
    {
        // Consider (ObjTypeSpec): Because we allocate these guards from the JIT thread we can't share guards for the same type across multiple functions.
        // This leads to proliferation of property guards on the thread context.  The alternative would be to pre-allocate shared (by value) guards
        // from the thread context during work item creation.  We would create too many of them (because some types aren't actually used as guards),
        // but we could share a guard for a given type between functions.  This may ultimately be better.

        LinkGuardToGuardedProperties(propertySymOpnd->GetGuardedPropOps(), [this, type, &guard](Js::PropertyId propertyId)
        {
            if (ShouldDoLazyFixedTypeBailout(this->m_func))
            {
                this->m_func->lazyBailoutProperties.Item(propertyId);
            }
            else
            {
                if (guard == nullptr)
                {
                    guard = this->m_func->GetOrCreateSingleTypeGuard(type->GetAddr());
                }

                if (PHASE_TRACE(Js::ObjTypeSpecPhase, this->m_func) || PHASE_TRACE(Js::TracePropertyGuardsPhase, this->m_func))
                {
                    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                    Output::Print(_u("ObjTypeSpec: function %s(%s) registered guard 0x%p with value 0x%p for property ID %u.\n"),
                        m_func->GetJITFunctionBody()->GetDisplayName(), this->m_func->GetDebugNumberSet(debugStringBuffer),
                        guard, guard->GetValue(), propertyId);
                    Output::Flush();
                }

                this->m_func->EnsurePropertyGuardsByPropertyId();
                this->m_func->LinkGuardToPropertyId(propertyId, guard);
            }
        });
    }

    return guard;
}